

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O1

bool helics::changeDetected(defV *prevValue,Time val,double deltaV)

{
  __index_type _Var1;
  variant_alternative_t<0UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar2;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar3;
  double dVar4;
  
  _Var1 = (prevValue->
          super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
          ).
          super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          .
          super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          .
          super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          .
          super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          .
          super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
          ._M_index;
  if (_Var1 == '\x01') {
    pvVar3 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (prevValue);
    dVar4 = (double)((*pvVar3 - val.internalTimeCode) % 1000000000) * 1e-09 +
            (double)((*pvVar3 - val.internalTimeCode) / 1000000000);
  }
  else {
    if (_Var1 != '\0') {
      return true;
    }
    pvVar2 = std::
             get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (prevValue);
    dVar4 = *pvVar2 - ((double)(val.internalTimeCode % 1000000000) * 1e-09 +
                      (double)(val.internalTimeCode / 1000000000));
  }
  return deltaV < ABS(dVar4);
}

Assistant:

bool changeDetected(const defV& prevValue, Time val, double deltaV)
{
    if (prevValue.index() == double_loc) {
        return (std::abs(std::get<double>(prevValue) - static_cast<double>(val)) > deltaV);
    }
    if (prevValue.index() == int_loc) {
        return (std::abs(Time(std::get<int64_t>(prevValue), time_units::ns) - val) > deltaV);
    }
    return true;
}